

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O1

string * __thiscall
ChildGenerator::handleFieldGeneration_abi_cxx11_
          (string *__return_storage_ptr__,ChildGenerator *this,int fieldIndex)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  pointer pCVar5;
  int iVar6;
  undefined1 *puVar7;
  int iVar8;
  long *plVar9;
  char *pcVar10;
  undefined8 *puVar11;
  ulong *puVar12;
  size_type *psVar13;
  int *arg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *tmp_finish;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined8 uVar17;
  ulong uVar18;
  string msgString;
  string elementString;
  string listIndexString;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_140 = __return_storage_ptr__;
  getFieldType_abi_cxx11_(&local_90,this,fieldIndex);
  iVar8 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar8 == 0) {
    std::operator+(&local_138,"    ",&this->parentName_);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
    paVar2 = &local_160.field_2;
    puVar12 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_160.field_2._M_allocated_capacity = *puVar12;
      local_160.field_2._8_8_ = plVar9[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar12;
      local_160._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_160._M_string_length = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    getFieldMsg_abi_cxx11_(&local_118,this,fieldIndex);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      uVar17 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_160._M_string_length + local_118._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar17 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_160._M_string_length + local_118._M_string_length)
      goto LAB_00117127;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_118,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_00117127:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_160,(ulong)local_118._M_dataplus._M_p);
    }
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    puVar12 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_180.field_2._M_allocated_capacity = *puVar12;
      local_180.field_2._8_8_ = puVar11[3];
    }
    else {
      local_180.field_2._M_allocated_capacity = *puVar12;
      local_180._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_180._M_string_length = puVar11[1];
    *puVar11 = puVar12;
    puVar11[1] = 0;
    *(char *)puVar12 = '\0';
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
    puVar12 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1a8.field_2._M_allocated_capacity = *puVar12;
      local_1a8.field_2._8_8_ = puVar11[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar12;
      local_1a8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1a8._M_string_length = puVar11[1];
    *puVar11 = puVar12;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    uVar17 = local_138.field_2._M_allocated_capacity;
    _Var15._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001186ae;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar8 == 0) {
      iVar4 = this->listIndex_;
      iVar8 = iVar4 + 1;
      this->listIndex_ = iVar8;
      paVar2 = &local_180.field_2;
      local_180._M_string_length = 0;
      local_180.field_2._M_allocated_capacity =
           local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8.field_2._8_8_ = (long)&local_1a8._M_dataplus._M_p + 2;
      puVar7 = (undefined1 *)((long)&local_1a8.field_2 + 7);
      iVar6 = -iVar8;
      if (0 < iVar8) {
        iVar6 = iVar8;
      }
      local_160._M_dataplus._M_p._0_4_ = iVar6;
      local_160.field_2._M_local_buf[0] = 0x30;
      local_160.field_2._M_allocated_capacity._4_4_ = 0x30;
      local_188 = puVar7;
      local_180._M_dataplus._M_p = (pointer)paVar2;
      local_160._M_string_length = (size_type)puVar7;
      local_1a8.field_2._8_8_ =
           boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                     ((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)&local_160);
      if (iVar4 < -1) {
        *(char *)(local_1a8.field_2._8_8_ + -1) = '-';
        local_1a8.field_2._8_8_ = local_1a8.field_2._8_8_ + -1;
      }
      local_188 = puVar7;
      std::__cxx11::string::replace
                ((ulong)&local_180,0,(char *)local_180._M_string_length,local_1a8.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_f8,"    Bottle& ",&this->parentName_);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_118.field_2._M_allocated_capacity = *puVar12;
        local_118.field_2._8_8_ = plVar9[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar12;
        local_118._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_118._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_d8._M_dataplus._M_p)
      ;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      puVar12 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_138.field_2._M_allocated_capacity = *puVar12;
        local_138.field_2._8_8_ = puVar11[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar12;
        local_138._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_138._M_string_length = puVar11[1];
      *puVar11 = puVar12;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
      paVar3 = &local_160.field_2;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_160.field_2._M_allocated_capacity = *puVar12;
        local_160.field_2._8_8_ = plVar9[3];
        local_160._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_160.field_2._M_allocated_capacity = *puVar12;
        local_160._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_160._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_160,(ulong)(this->parentName_)._M_dataplus._M_p);
      puVar12 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_180.field_2._M_allocated_capacity = *puVar12;
        local_180.field_2._8_8_ = puVar11[3];
        local_180._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *puVar12;
        local_180._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_180._M_string_length = puVar11[1];
      *puVar11 = puVar12;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      puVar12 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_1a8.field_2._M_allocated_capacity = *puVar12;
        local_1a8.field_2._8_8_ = puVar11[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar12;
        local_1a8._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_1a8._M_string_length = puVar11[1];
      *puVar11 = puVar12;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar3) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      getFieldMsg_abi_cxx11_(&local_1a8,this,fieldIndex);
      if (local_1a8._M_string_length != 0) {
        uVar18 = 0;
        do {
          if ((local_1a8._M_string_length - 1 == uVar18) ||
             (local_1a8._M_dataplus._M_p[uVar18] == ',')) {
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            local_180._M_string_length = 0;
            local_180.field_2._M_allocated_capacity =
                 local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (local_1a8._M_string_length - 1 == uVar18) {
              std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_1a8);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_1a8);
            }
            std::__cxx11::string::operator=((string *)&local_180,(string *)&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar3) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            local_160._M_dataplus._M_p = " ";
            local_160._M_string_length = 0x11bed4;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_180._M_dataplus._M_p + local_180._M_string_length);
            _Var15._M_p = local_180._M_dataplus._M_p;
            for (pcVar10 = (char *)local_180._M_string_length; paVar16 = paVar14,
                pcVar10 != (char *)0x0; pcVar10 = pcVar10 + -1) {
              if (*_Var15._M_p == ' ') {
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)_Var15._M_p + 1);
                paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var15._M_p;
                break;
              }
              _Var15._M_p = _Var15._M_p + 1;
            }
            if (paVar16 != paVar14) {
              boost::algorithm::detail::
              find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                        (&local_180);
            }
            std::operator+(&local_70,"    ",&this->parentName_);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
            psVar13 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_b8.field_2._M_allocated_capacity = *psVar13;
              local_b8.field_2._8_8_ = plVar9[3];
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar13;
              local_b8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_b8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
            psVar13 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_f8.field_2._M_allocated_capacity = *psVar13;
              local_f8.field_2._8_8_ = plVar9[3];
              local_f8._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar13;
              local_f8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_f8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            puVar12 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_118.field_2._M_allocated_capacity = *puVar12;
              local_118.field_2._8_8_ = plVar9[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar12;
              local_118._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_118._M_string_length = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_118,(ulong)local_180._M_dataplus._M_p);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            puVar12 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_138.field_2._M_allocated_capacity = *puVar12;
              local_138.field_2._8_8_ = puVar11[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *puVar12;
              local_138._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_138._M_string_length = puVar11[1];
            *puVar11 = puVar12;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
            puVar12 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_160.field_2._M_allocated_capacity = *puVar12;
              local_160.field_2._8_8_ = plVar9[3];
              local_160._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_160.field_2._M_allocated_capacity = *puVar12;
              local_160._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_160._M_string_length = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_140,(ulong)local_160._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar3) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < local_1a8._M_string_length);
      }
      std::__cxx11::string::append((char *)local_140);
      uVar17 = local_1a8.field_2._M_allocated_capacity;
      _Var15._M_p = local_1a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_001186ae;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar8 == 0) {
        iVar4 = this->listIndex_;
        iVar8 = iVar4 + 1;
        this->listIndex_ = iVar8;
        paVar2 = &local_180.field_2;
        local_180._M_string_length = 0;
        local_180.field_2._M_allocated_capacity =
             local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1a8.field_2._8_8_ = (long)&local_1a8._M_dataplus._M_p + 2;
        puVar7 = (undefined1 *)((long)&local_1a8.field_2 + 7);
        iVar6 = -iVar8;
        if (0 < iVar8) {
          iVar6 = iVar8;
        }
        local_160._M_dataplus._M_p._0_4_ = iVar6;
        local_160.field_2._M_local_buf[0] = 0x30;
        local_160.field_2._M_allocated_capacity._4_4_ = 0x30;
        local_188 = puVar7;
        local_180._M_dataplus._M_p = (pointer)paVar2;
        local_160._M_string_length = (size_type)puVar7;
        local_1a8.field_2._8_8_ =
             boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                       ((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)&local_160
                       );
        if (iVar4 < -1) {
          *(char *)(local_1a8.field_2._8_8_ + -1) = '-';
          local_1a8.field_2._8_8_ = local_1a8.field_2._8_8_ + -1;
        }
        local_188 = puVar7;
        std::__cxx11::string::replace
                  ((ulong)&local_180,0,(char *)local_180._M_string_length,local_1a8.field_2._8_8_);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if (this->toRos_ == true) {
          std::__cxx11::string::append((char *)local_140);
          std::__cxx11::string::append((char *)local_140);
          psVar1 = &this->parentName_;
          std::operator+(&local_f8,"    Bottle& ",psVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
          puVar12 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_118.field_2._M_allocated_capacity = *puVar12;
            local_118.field_2._8_8_ = plVar9[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar12;
            local_118._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_118._M_string_length = plVar9[1];
          *plVar9 = (long)puVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_118,(ulong)local_d8._M_dataplus._M_p);
          paVar3 = &local_138.field_2;
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_138.field_2._M_allocated_capacity = *puVar12;
            local_138.field_2._8_8_ = puVar11[3];
            local_138._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar12;
            local_138._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_138._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar14 = &local_160.field_2;
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar9[3];
            local_160._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_160._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_160,(ulong)(this->parentName_)._M_dataplus._M_p
                                     );
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180.field_2._8_8_ = plVar9[3];
            local_180._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_180._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
          paVar16 = &local_1a8.field_2;
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8.field_2._8_8_ = plVar9[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_1a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar16) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != paVar2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar14) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar3) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar9[3];
            local_160._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_160._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_160,(ulong)local_d8._M_dataplus._M_p);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180.field_2._8_8_ = plVar9[3];
            local_180._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_180._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8.field_2._8_8_ = plVar9[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_1a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar16) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != paVar2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar14) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar3) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar1);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_160.field_2._M_allocated_capacity = *puVar12;
            local_160.field_2._8_8_ = puVar11[3];
            local_160._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.field_2._M_allocated_capacity = *puVar12;
            local_160._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_160._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_160,(ulong)local_d8._M_dataplus._M_p);
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_180.field_2._M_allocated_capacity = *puVar12;
            local_180.field_2._8_8_ = puVar11[3];
            local_180._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar12;
            local_180._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_180._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8.field_2._8_8_ = puVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_1a8._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
        }
        else {
          psVar1 = &this->parentName_;
          std::operator+(&local_f8,"    Bottle& ",psVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
          puVar12 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_118.field_2._M_allocated_capacity = *puVar12;
            local_118.field_2._8_8_ = plVar9[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar12;
            local_118._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_118._M_string_length = plVar9[1];
          *plVar9 = (long)puVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_118,(ulong)local_d8._M_dataplus._M_p);
          paVar3 = &local_138.field_2;
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_138.field_2._M_allocated_capacity = *puVar12;
            local_138.field_2._8_8_ = puVar11[3];
            local_138._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar12;
            local_138._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_138._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar14 = &local_160.field_2;
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar9[3];
            local_160._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_160._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_160,(ulong)(this->parentName_)._M_dataplus._M_p
                                     );
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180.field_2._8_8_ = plVar9[3];
            local_180._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_180._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
          paVar16 = &local_1a8.field_2;
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8.field_2._8_8_ = plVar9[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_1a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar16) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != paVar2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar14) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar3) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar9[3];
            local_160._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_160._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_160,(ulong)local_d8._M_dataplus._M_p);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180.field_2._8_8_ = plVar9[3];
            local_180._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar13;
            local_180._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_180._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8.field_2._8_8_ = plVar9[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar13;
            local_1a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_1a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar16) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != paVar2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar14) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar3) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
          puVar12 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_160.field_2._M_allocated_capacity = *puVar12;
            local_160.field_2._8_8_ = plVar9[3];
            local_160._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.field_2._M_allocated_capacity = *puVar12;
            local_160._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_160._M_string_length = plVar9[1];
          *plVar9 = (long)puVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_160,(ulong)local_d8._M_dataplus._M_p);
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_180.field_2._M_allocated_capacity = *puVar12;
            local_180.field_2._8_8_ = puVar11[3];
            local_180._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar12;
            local_180._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_180._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
          puVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8.field_2._8_8_ = puVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_1a8._M_string_length = puVar11[1];
          *puVar11 = puVar12;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_138.field_2._M_allocated_capacity;
        _Var15._M_p = local_138._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001186ae;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar8 != 0) {
          iVar8 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar8 == 0) {
            iVar4 = this->listIndex_;
            iVar8 = iVar4 + 1;
            this->listIndex_ = iVar8;
            paVar2 = &local_180.field_2;
            local_180._M_string_length = 0;
            local_180.field_2._M_allocated_capacity =
                 local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1a8.field_2._8_8_ = (long)&local_1a8._M_dataplus._M_p + 2;
            puVar7 = (undefined1 *)((long)&local_1a8.field_2 + 7);
            iVar6 = -iVar8;
            if (0 < iVar8) {
              iVar6 = iVar8;
            }
            local_160._M_dataplus._M_p._0_4_ = iVar6;
            local_160.field_2._M_local_buf[0] = 0x30;
            local_160.field_2._M_allocated_capacity._4_4_ = 0x30;
            local_188 = puVar7;
            local_180._M_dataplus._M_p = (pointer)paVar2;
            local_160._M_string_length = (size_type)puVar7;
            local_1a8.field_2._8_8_ =
                 boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                 convert((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)
                         &local_160);
            if (iVar4 < -1) {
              *(char *)(local_1a8.field_2._8_8_ + -1) = '-';
              local_1a8.field_2._8_8_ = local_1a8.field_2._8_8_ + -1;
            }
            local_188 = puVar7;
            std::__cxx11::string::replace
                      ((ulong)&local_180,0,(char *)local_180._M_string_length,
                       local_1a8.field_2._8_8_);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_180);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != paVar2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if (this->toRos_ == true) {
              psVar1 = &this->parentName_;
              std::operator+(&local_f8,"    Bottle& ",psVar1);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_118.field_2._M_allocated_capacity = *psVar13;
                local_118.field_2._8_8_ = plVar9[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *psVar13;
                local_118._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_118._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d8);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
              paVar3 = &local_160.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_160.field_2._M_allocated_capacity = *psVar13;
                local_160.field_2._8_8_ = plVar9[3];
                local_160._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar13;
                local_160._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_160._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::operator+(&local_180,&local_160,psVar1);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
              paVar14 = &local_1a8.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a8.field_2._M_allocated_capacity = *psVar13;
                local_1a8.field_2._8_8_ = plVar9[3];
                local_1a8._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar13;
                local_1a8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1a8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar14) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != paVar2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar3) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              getFieldMux_abi_cxx11_(&local_160,this,fieldIndex);
              std::operator+(&local_180,"    for(int i = 0; i < ",&local_160);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a8.field_2._M_allocated_capacity = *psVar13;
                local_1a8.field_2._8_8_ = plVar9[3];
                local_1a8._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar13;
                local_1a8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1a8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar14) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != paVar2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar3) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_f8,"      ",psVar1);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              puVar12 = (ulong *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_118.field_2._M_allocated_capacity = *puVar12;
                local_118.field_2._8_8_ = plVar9[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar12;
                local_118._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_118._M_string_length = plVar9[1];
              *plVar9 = (long)puVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
              puVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_160.field_2._M_allocated_capacity = *puVar12;
                local_160.field_2._8_8_ = puVar11[3];
                local_160._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_160.field_2._M_allocated_capacity = *puVar12;
                local_160._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_160._M_string_length = puVar11[1];
              *puVar11 = puVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              getFieldMux_abi_cxx11_(&local_b8,this,fieldIndex);
              std::operator+(&local_180,&local_160,&local_b8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              puVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8.field_2._8_8_ = puVar11[3];
                local_1a8._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1a8._M_string_length = puVar11[1];
              *puVar11 = puVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar14) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != paVar2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar3) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              getFieldMux_abi_cxx11_(&local_160,this,fieldIndex);
              std::operator+(&local_180,"    for(int i = 0; i < ",&local_160);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
              paVar3 = &local_1a8.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_1a8.field_2._M_allocated_capacity = *psVar13;
                local_1a8.field_2._8_8_ = plVar9[3];
                local_1a8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar13;
                local_1a8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1a8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar3) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != paVar2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              paVar14 = &local_160.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar14) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_f8,"      ",&this->parentName_);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
              puVar12 = (ulong *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_118.field_2._M_allocated_capacity = *puVar12;
                local_118.field_2._8_8_ = plVar9[3];
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar12;
                local_118._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_118._M_string_length = plVar9[1];
              *plVar9 = (long)puVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
              puVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_160.field_2._M_allocated_capacity = *puVar12;
                local_160.field_2._8_8_ = puVar11[3];
                local_160._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                local_160.field_2._M_allocated_capacity = *puVar12;
                local_160._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_160._M_string_length = puVar11[1];
              *puVar11 = puVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              getFieldMux_abi_cxx11_(&local_b8,this,fieldIndex);
              std::operator+(&local_180,&local_160,&local_b8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              puVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8.field_2._8_8_ = puVar11[3];
                local_1a8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1a8._M_string_length = puVar11[1];
              *puVar11 = puVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar3) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != paVar2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar14) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)local_140);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar8 == 0) {
              this->listIndex_ = this->listIndex_ + 1;
              boost::lexical_cast<std::__cxx11::string,int>
                        (&local_1a8,(boost *)&this->listIndex_,arg);
              std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_1a8);
              paVar2 = &local_1a8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              psVar1 = &this->parentName_;
              std::operator+(&local_f8,"    Bottle& ",psVar1);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
              puVar12 = (ulong *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_118.field_2._M_allocated_capacity = *puVar12;
                local_118.field_2._8_8_ = plVar9[3];
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar12;
                local_118._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_118._M_string_length = plVar9[1];
              *plVar9 = (long)puVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
              puVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_160.field_2._M_allocated_capacity = *puVar12;
                local_160.field_2._8_8_ = puVar11[3];
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              }
              else {
                local_160.field_2._M_allocated_capacity = *puVar12;
                local_160._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_160._M_string_length = puVar11[1];
              *puVar11 = puVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::operator+(&local_180,&local_160,psVar1);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              puVar12 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8.field_2._8_8_ = puVar11[3];
                local_1a8._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1a8._M_string_length = puVar11[1];
              *puVar11 = puVar12;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              pCVar5 = (this->children_).
                       super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((this->children_).
                  super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                  super__Vector_impl_data._M_finish == pCVar5) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              std::operator+(&local_1a8,psVar1,"_");
              std::operator+(&local_50,&local_1a8,&local_d8);
              std::__cxx11::string::_M_assign((string *)&pCVar5->parentName_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              pCVar5 = (this->children_).
                       super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((this->children_).
                  super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                  super__Vector_impl_data._M_finish == pCVar5) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              (**(pCVar5->super_YarpCodeGenerator)._vptr_YarpCodeGenerator)(&local_1a8);
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              std::vector<ChildGenerator,_std::allocator<ChildGenerator>_>::erase
                        (&this->children_,
                         (this->children_).
                         super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl
                         .super__Vector_impl_data._M_start);
            }
          }
          goto LAB_001186ae;
        }
        std::operator+(&local_180,"    ",&this->parentName_);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
        puVar12 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8.field_2._8_8_ = puVar11[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar12;
          local_1a8._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1a8._M_string_length = puVar11[1];
        *puVar11 = puVar12;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_180.field_2._M_allocated_capacity;
        _Var15._M_p = local_180._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p == &local_180.field_2) goto LAB_001186ae;
      }
    }
  }
  operator_delete(_Var15._M_p,uVar17 + 1);
LAB_001186ae:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return local_140;
}

Assistant:

std::string ChildGenerator::handleFieldGeneration(int fieldIndex) {
  std::string code;

  std::string listIndexString;

  std::string type = getFieldType(fieldIndex);

  if(type == "single_value") {
    code += "    " + parentName_ + ".add(" + getFieldMsg(fieldIndex) + ");\n\n";
  } else if(type == "list") {
      listIndex_++;
      listIndexString = boost::lexical_cast<std::string>(listIndex_);
      code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
      int elementIndex = 0;
      std::string msgString = getFieldMsg(fieldIndex);
      for(int i = 0; i < msgString.size(); i++) {
        if(msgString.at(i) == ',' || i == (msgString.size() - 1)) {
          std::string elementString;
          if(i == (msgString.size() - 1))
            elementString = msgString.substr(elementIndex, ((i - elementIndex) + 1));
          else
            elementString = msgString.substr(elementIndex, (i - elementIndex));
          boost::erase_all(elementString, " ");
          code += "    " + parentName_ + "_" + listIndexString + ".add(" + elementString + ");\n";
          elementIndex = i + 1;
        }
      }
      code += "\n";
    } else if(type == "timestamp") {
        listIndex_++;
        listIndexString = boost::lexical_cast<std::string>(listIndex_);
        if (toRos_){
            code += "    double dummy;\n";
            code += "    double frac=modf(timestamp,&dummy);\n";
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)timestamp);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)round(frac*pow(10,9)));\n\n";
        }
        else {
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(counter);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(timestamp);\n";
        }
      } else if(type == "counter") {
          code += "    " + parentName_ + ".add(counter);\n\n";
        } else if(type == "mux") {
            listIndex_++;
            listIndexString = boost::lexical_cast<std::string>(listIndex_);
            if (toRos_)
            {
                code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }
            else {
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }

          } else if(type == "msg") {
              listIndex_++;
              listIndexString = boost::lexical_cast<std::string>(listIndex_);
              code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
              getFirstChild().setParentName(parentName_ + "_" + listIndexString);
              code += getFirstChild().generateCode();
              removeFirstChild();
            }

  return code;
}